

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::BringWindowToFocusFront(ImGuiWindow *window)

{
  short *psVar1;
  ImGuiContext *pIVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ImGuiWindow **ppIVar6;
  
  pIVar2 = GImGui;
  ppIVar6 = (GImGui->WindowsFocusOrder).Data;
  lVar3 = (long)(GImGui->WindowsFocusOrder).Size;
  if (ppIVar6[lVar3 + -1] != window) {
    lVar3 = lVar3 + -1;
    lVar4 = lVar3;
    if ((int)window->FocusOrder < (int)lVar3) {
      lVar5 = (long)(int)window->FocusOrder;
      lVar4 = (long)(int)lVar3;
      do {
        ppIVar6 = (pIVar2->WindowsFocusOrder).Data;
        ppIVar6[lVar5] = ppIVar6[lVar5 + 1];
        psVar1 = &(pIVar2->WindowsFocusOrder).Data[lVar5]->FocusOrder;
        *psVar1 = *psVar1 + -1;
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
      ppIVar6 = (pIVar2->WindowsFocusOrder).Data;
    }
    ppIVar6[lVar4] = window;
    window->FocusOrder = (short)lVar3;
  }
  return;
}

Assistant:

void ImGui::BringWindowToFocusFront(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(window == window->RootWindow);

    const int cur_order = window->FocusOrder;
    IM_ASSERT(g.WindowsFocusOrder[cur_order] == window);
    if (g.WindowsFocusOrder.back() == window)
        return;

    const int new_order = g.WindowsFocusOrder.Size - 1;
    for (int n = cur_order; n < new_order; n++)
    {
        g.WindowsFocusOrder[n] = g.WindowsFocusOrder[n + 1];
        g.WindowsFocusOrder[n]->FocusOrder--;
        IM_ASSERT(g.WindowsFocusOrder[n]->FocusOrder == n);
    }
    g.WindowsFocusOrder[new_order] = window;
    window->FocusOrder = (short)new_order;
}